

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::TLVReader::TLVReader(TLVReader *this,byte_t *p,ui32_t c,IPrimerLookup *PrimerLookup)

{
  ui32_t uVar1;
  int iVar2;
  ILogSink *this_00;
  bool bVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>,_bool>
  pVar4;
  Result_t local_130 [104];
  _Base_ptr local_c8;
  undefined1 local_c0;
  pair<unsigned_int,_unsigned_int> local_b4;
  pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_> local_ac;
  ui16_t local_a0;
  TagValue local_9e [3];
  ui16_t pkt_len;
  TagValue Tag;
  Result_t local_90 [8];
  Result_t result;
  IPrimerLookup *PrimerLookup_local;
  ui32_t c_local;
  byte_t *p_local;
  TLVReader *this_local;
  
  Kumu::MemIOReader::MemIOReader(&this->super_MemIOReader,p,c);
  std::
  map<ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>,_std::less<ASDCP::TagValue>,_std::allocator<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  ::map(&this->m_ElementMap);
  this->m_Lookup = PrimerLookup;
  Kumu::Result_t::Result_t(local_90,(Result_t *)Kumu::RESULT_OK);
LAB_002307be:
  uVar1 = Kumu::MemIOReader::Remainder(&this->super_MemIOReader);
  bVar3 = false;
  if (uVar1 != 0) {
    iVar2 = Kumu::Result_t::operator_cast_to_int(local_90);
    bVar3 = -1 < iVar2;
  }
  if (!bVar3) {
    Kumu::Result_t::~Result_t(local_90);
    return;
  }
  local_a0 = 0;
  bVar3 = Kumu::MemIOReader::ReadUi8(&this->super_MemIOReader,&local_9e[0].a);
  if (((bVar3) &&
      (bVar3 = Kumu::MemIOReader::ReadUi8(&this->super_MemIOReader,&local_9e[0].b), bVar3)) &&
     (bVar3 = Kumu::MemIOReader::ReadUi16BE(&this->super_MemIOReader,&local_a0), bVar3))
  goto LAB_002308ae;
  goto LAB_00230994;
LAB_002308ae:
  std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_short_&,_true>
            (&local_b4,&(this->super_MemIOReader).m_size,&local_a0);
  std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>::
  pair<ASDCP::TagValue_&,_std::pair<unsigned_int,_unsigned_int>,_true>(&local_ac,local_9e,&local_b4)
  ;
  pVar4 = std::
          map<ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>,_std::less<ASDCP::TagValue>,_std::allocator<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          ::insert(&this->m_ElementMap,&local_ac);
  local_c8 = (_Base_ptr)pVar4.first._M_node;
  local_c0 = pVar4.second;
  bVar3 = Kumu::MemIOReader::SkipOffset(&this->super_MemIOReader,(uint)local_a0);
  if (!bVar3) {
LAB_00230994:
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(this_00,"Malformed Set\n");
    std::
    map<ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>,_std::less<ASDCP::TagValue>,_std::allocator<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::clear(&this->m_ElementMap);
    Kumu::Result_t::operator()((int *)local_130,ASDCP::RESULT_KLV_CODING);
    Kumu::Result_t::operator=(local_90,local_130);
    Kumu::Result_t::~Result_t(local_130);
  }
  goto LAB_002307be;
}

Assistant:

ASDCP::MXF::TLVReader::TLVReader(const byte_t* p, ui32_t c, IPrimerLookup* PrimerLookup) :
  MemIOReader(p, c), m_Lookup(PrimerLookup)
{
  Result_t result = RESULT_OK;

  while ( Remainder() > 0 && ASDCP_SUCCESS(result) )
    {
      TagValue Tag;
      ui16_t pkt_len = 0;

      if ( MemIOReader::ReadUi8(&Tag.a) )
	if ( MemIOReader::ReadUi8(&Tag.b) )
	  if ( MemIOReader::ReadUi16BE(&pkt_len) )
	    {
	      m_ElementMap.insert(TagMap::value_type(Tag, ItemInfo(m_size, pkt_len)));
	      if ( SkipOffset(pkt_len) )
		continue;;
	    }

      DefaultLogSink().Error("Malformed Set\n");
      m_ElementMap.clear();
      result = RESULT_KLV_CODING(__LINE__, __FILE__);
    }
}